

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  char cVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  
  uVar4 = args->gp_offset;
  if ((ulong)uVar4 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar4 + (long)args->reg_save_area);
    args->gp_offset = uVar4 + 8;
  }
  else {
    puVar5 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 1;
  }
  puVar2 = (uint *)*puVar5;
  if (puVar2 == (uint *)0x0) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (ctx->frame_worker == (AVxWorker *)0x0) {
    return AOM_CODEC_ERROR;
  }
  lVar3 = *ctx->frame_worker->data1;
  *puVar2 = 0;
  cVar1 = *(char *)(lVar3 + 0x3b60);
  if (cVar1 == '\x03') {
    uVar4 = 0x20;
  }
  else if (cVar1 == '\x02') {
    uVar4 = 0x10;
  }
  else {
    if (cVar1 != '\0') goto LAB_0016f2b2;
    *puVar2 = 0x11;
    uVar4 = (uint)(*(int *)(lVar3 + 0x3d40) == 0) << 7 | 0x11;
  }
  *puVar2 = uVar4;
LAB_0016f2b2:
  if (*(char *)(lVar3 + 0x3d56) == '\x01') {
    *(byte *)puVar2 = (byte)*puVar2 | 0x40;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  AV1Decoder *pbi = ((FrameWorkerData *)ctx->frame_worker->data1)->pbi;
  *arg = 0;
  switch (pbi->common.current_frame.frame_type) {
    case KEY_FRAME:
      *arg |= AOM_FRAME_IS_KEY;
      *arg |= AOM_FRAME_IS_INTRAONLY;
      if (!pbi->common.show_frame) {
        *arg |= AOM_FRAME_IS_DELAYED_RANDOM_ACCESS_POINT;
      }
      break;
    case INTRA_ONLY_FRAME: *arg |= AOM_FRAME_IS_INTRAONLY; break;
    case S_FRAME: *arg |= AOM_FRAME_IS_SWITCH; break;
  }
  if (pbi->common.features.error_resilient_mode) {
    *arg |= AOM_FRAME_IS_ERROR_RESILIENT;
  }
  return AOM_CODEC_OK;
}